

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceInterpolateAt_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,ShaderFunction function,DataType interpolantDataType,
          DataType secondArgumentDataType)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  ostream *poVar5;
  ShaderType shaderType_00;
  _Alloc_hider _Var6;
  ostringstream source;
  undefined1 auStack_418 [12];
  DataType local_40c;
  string *local_408;
  string local_400;
  long *local_3e0;
  long local_3d8;
  long local_3d0 [2];
  string local_3c0;
  string local_3a0;
  long *local_380;
  long local_378;
  long local_370 [2];
  string local_360;
  string local_340;
  undefined1 local_320 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310 [6];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [376];
  
  shaderType_00 = shaderType;
  local_40c = interpolantDataType;
  local_408 = __return_storage_ptr__;
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_418 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x270);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  getShaderInitialization_abi_cxx11_
            (&local_340,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_340._M_dataplus._M_p,local_340._M_string_length);
  if (bVar1) {
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,0x1b32ab9);
  }
  else {
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_360,"GL_OES_shader_multisample_interpolation","");
    NegativeTestShared::anon_unknown_0::getShaderExtensionDeclaration(&local_400,&local_360);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_400._M_dataplus._M_p,local_400._M_string_length);
  local_3e0 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"interpolant","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"in ",3);
  pcVar2 = glu::getPrecisionName(PRECISION_HIGHP);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_418 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0xf8);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  pcVar2 = glu::getDataTypeName(function);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_418 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0xf8);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,(char *)local_3e0,local_3d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_380,local_378);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  if (local_380 != local_370) {
    operator_delete(local_380,local_370[0] + 1);
  }
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0,local_3d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2)) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if (shaderType == 0x18) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    interpolateAtCentroid(interpolant);\n",0x28);
  }
  else {
    if (shaderType == 0x19) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\tmediump ",9);
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"sample","");
      NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
                ((string *)local_320,local_40c,&local_3a0);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_320._0_8_,local_320._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"    interpolateAtSample(interpolant, sample);\n",0x2e);
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
      }
      local_3c0.field_2._M_allocated_capacity = local_3a0.field_2._M_allocated_capacity;
      _Var6._M_p = local_3a0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p == &local_3a0.field_2) goto LAB_0163ffc5;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\tmediump ",9);
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"offset","");
      NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
                ((string *)local_320,local_40c,&local_3c0);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_320._0_8_,local_320._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"    interpolateAtOffset(interpolant, offset);\n",0x2e);
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
      }
      _Var6._M_p = local_3c0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p == &local_3c0.field_2) goto LAB_0163ffc5;
    }
    operator_delete(_Var6._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
LAB_0163ffc5:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_408;
}

Assistant:

std::string genShaderSourceInterpolateAt (NegativeTestContext& ctx, glu::ShaderType shaderType, ShaderFunction function, glu::DataType interpolantDataType, glu::DataType secondArgumentDataType)
{
	DE_ASSERT(function >= SHADER_FUNCTION_INTERPOLATED_AT_CENTROID && function <= SHADER_FUNCTION_INTERPOLATED_AT_OFFSET);

	const bool			supportsES32 = contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	std::ostringstream	source;

	source	<< (supportsES32 ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderInitialization(ctx, shaderType)
			<< (supportsES32 ? "" : getShaderExtensionDeclaration("GL_OES_shader_multisample_interpolation"))
			<< declareShaderInput(interpolantDataType, "interpolant")
			<< "void main()\n"
			<< "{\n";

	switch (function)
	{
		case SHADER_FUNCTION_INTERPOLATED_AT_CENTROID:
			source << "    interpolateAtCentroid(interpolant);\n";
			break;

		case SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE:
			source	<< "	mediump " << declareAndInitializeShaderVariable(secondArgumentDataType, "sample")
					<< "    interpolateAtSample(interpolant, sample);\n";
			break;

		case SHADER_FUNCTION_INTERPOLATED_AT_OFFSET:
			source	<< "	mediump " << declareAndInitializeShaderVariable(secondArgumentDataType, "offset")
					<< "    interpolateAtOffset(interpolant, offset);\n";
			break;

		default:
			DE_FATAL("Unsupported shader function.");
	}

	source << "}\n";

	return source.str();
}